

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

Time __thiscall helics::FederateState::nextValueTime(FederateState *this)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __lhs;
  long in_RDI;
  Time nvt;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *inp;
  const_iterator __end1;
  const_iterator __begin1;
  shared_handle *__range1;
  TimeRepresentation<count_time<9,_long>_> firstValueTime;
  Time in_stack_ffffffffffffff78;
  TimeRepresentation<count_time<9,_long>_> local_60;
  reference local_58;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *local_50;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = 0x7fffffffffffffff;
  InterfaceInfo::getInputs_abi_cxx11_((InterfaceInfo *)in_stack_ffffffffffffff78.internalTimeCode);
  local_18 = local_30;
  this_00 = gmlc::libguarded::
            shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                     *)in_stack_ffffffffffffff78.internalTimeCode);
  local_38._M_current =
       (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)this_00;
  __lhs = gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                 *)in_stack_ffffffffffffff78.internalTimeCode);
  local_50 = (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)__lhs;
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                           ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                             *)in_stack_ffffffffffffff78.internalTimeCode),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
               ::operator*(&local_38);
    std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
              ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)0x580c45);
    in_stack_ffffffffffffff78 = InputInfo::nextValueTime((InputInfo *)this_00._M_current);
    local_60.internalTimeCode = in_stack_ffffffffffffff78.internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                      (&local_60,(TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508));
    if ((bVar1) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_60,&local_8), bVar1)) {
      local_8.internalTimeCode = local_60.internalTimeCode;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
    ::operator++(&local_38);
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              *)0x580c0a);
  return (Time)local_8.internalTimeCode;
}

Assistant:

Time FederateState::nextValueTime() const
{
    auto firstValueTime = Time::maxVal();
    for (const auto& inp : interfaceInformation.getInputs()) {
        auto nvt = inp->nextValueTime();
        if (nvt >= time_granted) {
            if (nvt < firstValueTime) {
                firstValueTime = nvt;
            }
        }
    }
    return firstValueTime;
}